

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateRowsPS::execute
          (DuplicateRowsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_1,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *y,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_4,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  undefined4 *puVar1;
  uint *puVar2;
  undefined8 *puVar3;
  int iVar4;
  pointer pnVar5;
  pointer pnVar6;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  undefined8 uVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  undefined4 uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int32_t iVar17;
  bool bVar18;
  int iVar19;
  long lVar20;
  cpp_dec_float<50U,_int,_void> *pcVar21;
  VarStatus VVar22;
  long lVar23;
  long lVar24;
  cpp_dec_float<50U,_int,_void> *pcVar25;
  cpp_dec_float<50U,_int,_void> *pcVar26;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar27;
  VarStatus *pVVar28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_b8;
  undefined1 local_78 [64];
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_38;
  
  if ((this->m_isLast == true) && (lVar20 = (long)(this->m_perm).thesize, 0 < lVar20)) {
    lVar23 = lVar20 + 1;
    lVar20 = lVar20 * 0xe + -2;
    do {
      lVar24 = (long)(this->m_perm).data[lVar23 + -2];
      if (-1 < lVar24) {
        pnVar5 = (s->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar20 * 4 + -0x10) =
             *(undefined8 *)((long)&pnVar5[lVar24].m_backend.data + 0x20);
        uVar8 = *(undefined8 *)&pnVar5[lVar24].m_backend.data;
        uVar15 = *(undefined8 *)((long)&pnVar5[lVar24].m_backend.data + 8);
        puVar2 = (uint *)((long)&pnVar5[lVar24].m_backend.data + 0x10);
        uVar16 = *(undefined8 *)(puVar2 + 2);
        puVar3 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar20 * 4 + -0x20);
        *puVar3 = *(undefined8 *)puVar2;
        puVar3[1] = uVar16;
        puVar3 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar20 * 4 + -0x30);
        *puVar3 = uVar8;
        puVar3[1] = uVar15;
        *(int *)((long)&(pnVar5->m_backend).data + lVar20 * 4 + -8) = pnVar5[lVar24].m_backend.exp;
        *(bool *)((long)&(pnVar5->m_backend).data + lVar20 * 4 + -4) = pnVar5[lVar24].m_backend.neg;
        *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar20 * 4) =
             *(undefined8 *)&pnVar5[lVar24].m_backend.fpclass;
        pnVar6 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar20 * 4 + -0x10) =
             *(undefined8 *)((long)&pnVar6[lVar24].m_backend.data + 0x20);
        pnVar5 = pnVar6 + lVar24;
        uVar10 = (pnVar5->m_backend).data._M_elems[0];
        uVar11 = *(uint *)((long)&(pnVar5->m_backend).data + 4);
        uVar12 = *(uint *)((long)&(pnVar5->m_backend).data + 8);
        uVar13 = *(uint *)((long)&(pnVar5->m_backend).data + 0xc);
        puVar2 = (uint *)((long)&pnVar6[lVar24].m_backend.data + 0x10);
        uVar8 = *(undefined8 *)(puVar2 + 2);
        puVar3 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar20 * 4 + -0x20);
        *puVar3 = *(undefined8 *)puVar2;
        puVar3[1] = uVar8;
        puVar1 = (undefined4 *)((long)&(pnVar6->m_backend).data + lVar20 * 4 + -0x30);
        *puVar1 = uVar10;
        puVar1[1] = uVar11;
        puVar1[2] = uVar12;
        puVar1[3] = uVar13;
        *(int *)((long)&(pnVar6->m_backend).data + lVar20 * 4 + -8) = pnVar6[lVar24].m_backend.exp;
        *(bool *)((long)&(pnVar6->m_backend).data + lVar20 * 4 + -4) = pnVar6[lVar24].m_backend.neg;
        *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar20 * 4) =
             *(undefined8 *)&pnVar6[lVar24].m_backend.fpclass;
        rStatus->data[lVar23 + -2] = rStatus->data[lVar24];
      }
      lVar23 = lVar23 + -1;
      lVar20 = lVar20 + -0xe;
    } while (1 < lVar23);
  }
  if (0 < (this->m_scale).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar20 = 0;
    lVar23 = 0;
    do {
      pNVar7 = (this->m_scale).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      if (*(int *)((long)(&pNVar7->val + 1) + lVar20) != this->m_i) {
        local_b8.fpclass = cpp_dec_float_finite;
        local_b8.prec_elem = 10;
        local_b8.data._M_elems[0] = 0;
        local_b8.data._M_elems[1] = 0;
        local_b8.data._M_elems[2] = 0;
        local_b8.data._M_elems[3] = 0;
        local_b8.data._M_elems[4] = 0;
        local_b8.data._M_elems[5] = 0;
        local_b8.data._M_elems._24_5_ = 0;
        local_b8.data._M_elems[7]._1_3_ = 0;
        local_b8.data._M_elems._32_5_ = 0;
        local_b8.data._M_elems[9]._1_3_ = 0;
        local_b8.exp = 0;
        local_b8.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_b8,
                   &(s->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)(pNVar7->val).m_backend.data._M_elems + lVar20));
        iVar4 = *(int *)((long)(&((this->m_scale).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem)->val + 1) + lVar20);
        pnVar6 = (s->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&pnVar6[iVar4].m_backend.data + 0x20) =
             CONCAT35(local_b8.data._M_elems[9]._1_3_,local_b8.data._M_elems._32_5_);
        puVar2 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = local_b8.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_b8.data._M_elems[7]._1_3_,local_b8.data._M_elems._24_5_);
        pnVar5 = pnVar6 + iVar4;
        (pnVar5->m_backend).data._M_elems[0] = local_b8.data._M_elems[0];
        *(uint *)((long)&(pnVar5->m_backend).data + 4) = local_b8.data._M_elems[1];
        *(uint *)((long)&(pnVar5->m_backend).data + 8) = local_b8.data._M_elems[2];
        *(uint *)((long)&(pnVar5->m_backend).data + 0xc) = local_b8.data._M_elems[3];
        pnVar6[iVar4].m_backend.exp = local_b8.exp;
        pnVar6[iVar4].m_backend.neg = local_b8.neg;
        pnVar6[iVar4].m_backend.fpclass = local_b8.fpclass;
        pnVar6[iVar4].m_backend.prec_elem = local_b8.prec_elem;
      }
      lVar23 = lVar23 + 1;
      lVar20 = lVar20 + 0x3c;
    } while (lVar23 < (this->m_scale).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  if (0 < (this->m_scale).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    local_78._56_8_ = &this->m_i_rowObj;
    lVar23 = 0;
    lVar20 = 0;
    bVar18 = false;
    local_38 = y;
    do {
      pNVar7 = (this->m_scale).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      iVar4 = *(int *)((long)(&pNVar7->val + 1) + lVar23);
      iVar19 = this->m_i;
      VVar22 = rStatus->data[iVar19];
      if ((VVar22 == BASIC) || ((bVar18 && (iVar4 != iVar19)))) {
LAB_0033292b:
        pNVar7 = (this->m_rowObj).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        pnVar6 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pnVar6[iVar4].m_backend.data + 0x20) =
             *(undefined8 *)((long)(pNVar7->val).m_backend.data._M_elems + lVar23 + 0x20);
        puVar1 = (undefined4 *)((long)(pNVar7->val).m_backend.data._M_elems + lVar23);
        uVar10 = *puVar1;
        uVar11 = puVar1[1];
        uVar12 = puVar1[2];
        uVar13 = puVar1[3];
        puVar3 = (undefined8 *)((long)(pNVar7->val).m_backend.data._M_elems + lVar23 + 0x10);
        uVar8 = puVar3[1];
        puVar2 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = *puVar3;
        *(undefined8 *)(puVar2 + 2) = uVar8;
        pnVar5 = pnVar6 + iVar4;
        (pnVar5->m_backend).data._M_elems[0] = uVar10;
        *(uint *)((long)&(pnVar5->m_backend).data + 4) = uVar11;
        *(uint *)((long)&(pnVar5->m_backend).data + 8) = uVar12;
        *(uint *)((long)&(pnVar5->m_backend).data + 0xc) = uVar13;
        pnVar6[iVar4].m_backend.exp = *(int *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar23);
        pnVar6[iVar4].m_backend.neg =
             *(bool *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar23 + 4);
        uVar8 = *(undefined8 *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar23 + 8);
        pnVar6[iVar4].m_backend.fpclass = (int)uVar8;
        pnVar6[iVar4].m_backend.prec_elem = (int)((ulong)uVar8 >> 0x20);
        pVVar28 = rStatus->data + iVar4;
LAB_0033297d:
        *pVVar28 = BASIC;
      }
      else if ((VVar22 == FIXED) && ((iVar4 == this->m_maxLhsIdx || (iVar4 == this->m_minRhsIdx))))
      {
        pcVar21 = &(y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar19].m_backend;
        pcVar25 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)(pNVar7->val).m_backend.data._M_elems + lVar23);
        local_b8.fpclass = cpp_dec_float_finite;
        local_b8.prec_elem = 10;
        local_b8.data._M_elems[0] = 0;
        local_b8.data._M_elems[1] = 0;
        local_b8.data._M_elems[2] = 0;
        local_b8.data._M_elems[3] = 0;
        local_b8.data._M_elems[4] = 0;
        local_b8.data._M_elems[5] = 0;
        local_b8.data._M_elems._24_5_ = 0;
        local_b8.data._M_elems[7]._1_3_ = 0;
        local_b8.data._M_elems._32_5_ = 0;
        local_b8.data._M_elems[9]._1_3_ = 0;
        local_b8.exp = 0;
        local_b8.neg = false;
        pcVar26 = pcVar21;
        if ((pcVar25 != &local_b8) && (pcVar26 = pcVar25, &local_b8 != pcVar21)) {
          uVar8 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 8);
          local_b8.data._M_elems._32_5_ = SUB85(uVar8,0);
          local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
          local_b8.data._M_elems._0_8_ =
               *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems;
          local_b8.data._M_elems._8_8_ =
               *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 2);
          local_b8.data._M_elems._16_8_ =
               *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 4);
          uVar8 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 6);
          local_b8.data._M_elems._24_5_ = SUB85(uVar8,0);
          local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
          local_b8.exp = pcVar21->exp;
          local_b8.neg = pcVar21->neg;
          local_b8.fpclass = pcVar21->fpclass;
          local_b8.prec_elem = pcVar21->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_b8,pcVar26);
        pnVar5 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)&pnVar5[iVar4].m_backend.data = local_b8.data._M_elems._0_8_;
        *(undefined8 *)((long)&pnVar5[iVar4].m_backend.data + 8) = local_b8.data._M_elems._8_8_;
        puVar2 = (uint *)((long)&pnVar5[iVar4].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = local_b8.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_b8.data._M_elems[7]._1_3_,local_b8.data._M_elems._24_5_);
        *(ulong *)((long)&pnVar5[iVar4].m_backend.data + 0x20) =
             CONCAT35(local_b8.data._M_elems[9]._1_3_,local_b8.data._M_elems._32_5_);
        pnVar5[iVar4].m_backend.exp = local_b8.exp;
        pnVar5[iVar4].m_backend.neg = local_b8.neg;
        pnVar5[iVar4].m_backend.fpclass = local_b8.fpclass;
        pnVar5[iVar4].m_backend.prec_elem = local_b8.prec_elem;
        iVar19 = this->m_i;
        pnVar6 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pnVar6[iVar19].m_backend.data + 0x20) =
             *(undefined8 *)
              ((((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems + 8);
        uVar11 = (((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems[0];
        uVar12 = (((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems[1];
        uVar13 = (((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems[2];
        uVar14 = (((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems[3];
        uVar8 = *(undefined8 *)
                 ((((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems + 6);
        puVar2 = (uint *)((long)&pnVar6[iVar19].m_backend.data + 0x10);
        *(undefined8 *)puVar2 =
             *(undefined8 *)
              ((((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems + 4);
        *(undefined8 *)(puVar2 + 2) = uVar8;
        pnVar5 = pnVar6 + iVar19;
        (pnVar5->m_backend).data._M_elems[0] = uVar11;
        *(uint *)((long)&(pnVar5->m_backend).data + 4) = uVar12;
        *(uint *)((long)&(pnVar5->m_backend).data + 8) = uVar13;
        *(uint *)((long)&(pnVar5->m_backend).data + 0xc) = uVar14;
        pnVar6[iVar19].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
        pnVar6[iVar19].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
        iVar17 = (this->m_i_rowObj).m_backend.prec_elem;
        pnVar6[iVar19].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
        pnVar6[iVar19].m_backend.prec_elem = iVar17;
        if ((this->m_isLhsEqualRhs).data[lVar20] == true) {
          rStatus->data[iVar4] = FIXED;
        }
        else {
          if (iVar4 == this->m_maxLhsIdx) {
            pNVar9 = (this->m_scale).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pNVar7 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)((long)(pNVar9->val).m_backend.data._M_elems + lVar23);
            local_78._48_4_ = cpp_dec_float_finite;
            local_78._52_4_ = 10;
            local_78._0_4_ = 0;
            local_78._4_4_ = 0;
            local_78._8_4_ = 0;
            local_78._12_4_ = 0;
            local_78._16_4_ = 0;
            local_78._20_4_ = 0;
            local_78._24_5_ = 0;
            local_78._29_3_ = 0;
            local_78._32_5_ = 0;
            local_78._37_3_ = 0;
            local_78._40_4_ = 0;
            local_78[0x2c] = false;
            pNVar27 = pNVar7;
            if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)local_78 != pNVar9) &&
               (pNVar27 = pNVar9,
               pNVar7 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)local_78)) {
              uVar8 = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 8);
              local_78._32_5_ = (undefined5)uVar8;
              local_78._37_3_ = (undefined3)((ulong)uVar8 >> 0x28);
              local_78._0_8_ = *(undefined8 *)(pNVar7->val).m_backend.data._M_elems;
              local_78._8_8_ = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 2);
              local_78._16_8_ = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 4);
              uVar8 = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 6);
              local_78._24_5_ = (undefined5)uVar8;
              local_78._29_3_ = (undefined3)((ulong)uVar8 >> 0x28);
              local_78._40_4_ = *(int *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar23);
              local_78[0x2c] =
                   *(undefined1 *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar23 + 4);
              local_78._48_8_ =
                   *(undefined8 *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar23 + 8);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      ((cpp_dec_float<50U,_int,_void> *)local_78,
                       (cpp_dec_float<50U,_int,_void> *)pNVar27);
            VVar22 = ON_UPPER;
            if (local_78._48_4_ != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_b8,0,(type *)0x0);
              iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_78,&local_b8);
              VVar22 = (VarStatus)(0 < iVar19);
            }
          }
          else {
            pNVar9 = (this->m_scale).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pNVar7 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)((long)(pNVar9->val).m_backend.data._M_elems + lVar23);
            local_78._48_4_ = cpp_dec_float_finite;
            local_78._52_4_ = 10;
            local_78._0_4_ = 0;
            local_78._4_4_ = 0;
            local_78._8_4_ = 0;
            local_78._12_4_ = 0;
            local_78._16_4_ = 0;
            local_78._20_4_ = 0;
            local_78._24_5_ = 0;
            local_78._29_3_ = 0;
            local_78._32_5_ = 0;
            local_78._37_3_ = 0;
            local_78._40_4_ = 0;
            local_78[0x2c] = false;
            pNVar27 = pNVar7;
            if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)local_78 != pNVar9) &&
               (pNVar27 = pNVar9,
               pNVar7 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)local_78)) {
              uVar8 = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 8);
              local_78._32_5_ = (undefined5)uVar8;
              local_78._37_3_ = (undefined3)((ulong)uVar8 >> 0x28);
              local_78._0_8_ = *(undefined8 *)(pNVar7->val).m_backend.data._M_elems;
              local_78._8_8_ = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 2);
              local_78._16_8_ = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 4);
              uVar8 = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 6);
              local_78._24_5_ = (undefined5)uVar8;
              local_78._29_3_ = (undefined3)((ulong)uVar8 >> 0x28);
              local_78._40_4_ = *(int *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar23);
              local_78[0x2c] =
                   *(undefined1 *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar23 + 4);
              local_78._48_8_ =
                   *(undefined8 *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar23 + 8);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      ((cpp_dec_float<50U,_int,_void> *)local_78,
                       (cpp_dec_float<50U,_int,_void> *)pNVar27);
            VVar22 = ON_LOWER;
            if (local_78._48_4_ != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_b8,0,(type *)0x0);
              iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_78,&local_b8);
              VVar22 = (VarStatus)(iVar19 < 1);
            }
          }
          rStatus->data[iVar4] = VVar22;
        }
        bVar18 = true;
        if (iVar4 != this->m_i) {
          pVVar28 = rStatus->data + this->m_i;
          bVar18 = true;
          goto LAB_0033297d;
        }
      }
      else {
        if ((VVar22 == ON_LOWER) && (iVar4 == this->m_maxLhsIdx)) {
          pcVar21 = &(y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar19].m_backend;
          pcVar25 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)(pNVar7->val).m_backend.data._M_elems + lVar23);
          local_b8.fpclass = cpp_dec_float_finite;
          local_b8.prec_elem = 10;
          local_b8.data._M_elems[0] = 0;
          local_b8.data._M_elems[1] = 0;
          local_b8.data._M_elems[2] = 0;
          local_b8.data._M_elems[3] = 0;
          local_b8.data._M_elems[4] = 0;
          local_b8.data._M_elems[5] = 0;
          local_b8.data._M_elems._24_5_ = 0;
          local_b8.data._M_elems[7]._1_3_ = 0;
          local_b8.data._M_elems._32_5_ = 0;
          local_b8.data._M_elems[9]._1_3_ = 0;
          local_b8.exp = 0;
          local_b8.neg = false;
          pcVar26 = pcVar21;
          if ((pcVar25 != &local_b8) && (pcVar26 = pcVar25, &local_b8 != pcVar21)) {
            uVar8 = *(undefined8 *)
                     ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 8);
            local_b8.data._M_elems._32_5_ = SUB85(uVar8,0);
            local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            local_b8.data._M_elems._0_8_ =
                 *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems;
            local_b8.data._M_elems._8_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 2);
            local_b8.data._M_elems._16_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 4);
            uVar8 = *(undefined8 *)
                     ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 6);
            local_b8.data._M_elems._24_5_ = SUB85(uVar8,0);
            local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            local_b8.exp = pcVar21->exp;
            local_b8.neg = pcVar21->neg;
            local_b8.fpclass = pcVar21->fpclass;
            local_b8.prec_elem = pcVar21->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_b8,pcVar26);
          pnVar5 = (y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)&pnVar5[iVar4].m_backend.data = local_b8.data._M_elems._0_8_;
          *(undefined8 *)((long)&pnVar5[iVar4].m_backend.data + 8) = local_b8.data._M_elems._8_8_;
          puVar2 = (uint *)((long)&pnVar5[iVar4].m_backend.data + 0x10);
          *(undefined8 *)puVar2 = local_b8.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_b8.data._M_elems[7]._1_3_,local_b8.data._M_elems._24_5_);
          *(ulong *)((long)&pnVar5[iVar4].m_backend.data + 0x20) =
               CONCAT35(local_b8.data._M_elems[9]._1_3_,local_b8.data._M_elems._32_5_);
          pnVar5[iVar4].m_backend.exp = local_b8.exp;
          pnVar5[iVar4].m_backend.neg = local_b8.neg;
          pnVar5[iVar4].m_backend.fpclass = local_b8.fpclass;
          pnVar5[iVar4].m_backend.prec_elem = local_b8.prec_elem;
          iVar19 = this->m_i;
          pnVar5 = (y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pnVar5[iVar19].m_backend.data + 0x20) =
               *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems + 8);
          uVar8 = *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems
          ;
          uVar15 = *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems + 2);
          uVar16 = *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems + 6);
          puVar2 = (uint *)((long)&pnVar5[iVar19].m_backend.data + 0x10);
          *(undefined8 *)puVar2 =
               *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems + 4);
          *(undefined8 *)(puVar2 + 2) = uVar16;
          *(undefined8 *)&pnVar5[iVar19].m_backend.data = uVar8;
          *(undefined8 *)((long)&pnVar5[iVar19].m_backend.data + 8) = uVar15;
          pnVar5[iVar19].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
          pnVar5[iVar19].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
          iVar17 = (this->m_i_rowObj).m_backend.prec_elem;
          pnVar5[iVar19].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
          pnVar5[iVar19].m_backend.prec_elem = iVar17;
          pNVar9 = (this->m_scale).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pNVar7 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)((long)(pNVar9->val).m_backend.data._M_elems + lVar23);
          local_78._48_4_ = cpp_dec_float_finite;
          local_78._52_4_ = 10;
          local_78._0_4_ = 0;
          local_78._4_4_ = 0;
          local_78._8_4_ = 0;
          local_78._12_4_ = 0;
          local_78._16_4_ = 0;
          local_78._20_4_ = 0;
          local_78._24_5_ = 0;
          local_78._29_3_ = 0;
          local_78._32_5_ = 0;
          local_78._37_3_ = 0;
          local_78._40_4_ = 0;
          local_78[0x2c] = false;
          pNVar27 = pNVar7;
          if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_78 != pNVar9) &&
             (pNVar27 = pNVar9,
             pNVar7 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)local_78)) {
            uVar8 = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 8);
            local_78._32_5_ = (undefined5)uVar8;
            local_78._37_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            local_78._0_8_ = *(undefined8 *)(pNVar7->val).m_backend.data._M_elems;
            local_78._8_8_ = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 2);
            local_78._16_8_ = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 4);
            uVar8 = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 6);
            local_78._24_5_ = (undefined5)uVar8;
            local_78._29_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            local_78._40_4_ = *(int *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar23);
            local_78[0x2c] = *(undefined1 *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar23 + 4)
            ;
            local_78._48_8_ =
                 *(undefined8 *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar23 + 8);
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    ((cpp_dec_float<50U,_int,_void> *)local_78,
                     (cpp_dec_float<50U,_int,_void> *)pNVar27);
          VVar22 = ON_UPPER;
          if (local_78._48_4_ != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&local_b8,0,(type *)0x0);
            y = local_38;
            iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_78,&local_b8);
            VVar22 = (VarStatus)(0 < iVar19);
          }
        }
        else {
          if ((VVar22 != ON_UPPER) || (iVar4 != this->m_minRhsIdx)) {
            if (iVar4 != iVar19) goto LAB_0033292b;
            goto LAB_00332985;
          }
          pcVar21 = &(y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar19].m_backend;
          pcVar25 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)(pNVar7->val).m_backend.data._M_elems + lVar23);
          local_b8.fpclass = cpp_dec_float_finite;
          local_b8.prec_elem = 10;
          local_b8.data._M_elems[0] = 0;
          local_b8.data._M_elems[1] = 0;
          local_b8.data._M_elems[2] = 0;
          local_b8.data._M_elems[3] = 0;
          local_b8.data._M_elems[4] = 0;
          local_b8.data._M_elems[5] = 0;
          local_b8.data._M_elems._24_5_ = 0;
          local_b8.data._M_elems[7]._1_3_ = 0;
          local_b8.data._M_elems._32_5_ = 0;
          local_b8.data._M_elems[9]._1_3_ = 0;
          local_b8.exp = 0;
          local_b8.neg = false;
          pcVar26 = pcVar21;
          if ((pcVar25 != &local_b8) && (pcVar26 = pcVar25, &local_b8 != pcVar21)) {
            uVar8 = *(undefined8 *)
                     ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 8);
            local_b8.data._M_elems._32_5_ = SUB85(uVar8,0);
            local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            local_b8.data._M_elems._0_8_ =
                 *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems;
            local_b8.data._M_elems._8_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 2);
            local_b8.data._M_elems._16_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 4);
            uVar8 = *(undefined8 *)
                     ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 6);
            local_b8.data._M_elems._24_5_ = SUB85(uVar8,0);
            local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            local_b8.exp = pcVar21->exp;
            local_b8.neg = pcVar21->neg;
            local_b8.fpclass = pcVar21->fpclass;
            local_b8.prec_elem = pcVar21->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_b8,pcVar26);
          pnVar5 = (y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)&pnVar5[iVar4].m_backend.data = local_b8.data._M_elems._0_8_;
          *(undefined8 *)((long)&pnVar5[iVar4].m_backend.data + 8) = local_b8.data._M_elems._8_8_;
          puVar2 = (uint *)((long)&pnVar5[iVar4].m_backend.data + 0x10);
          *(undefined8 *)puVar2 = local_b8.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_b8.data._M_elems[7]._1_3_,local_b8.data._M_elems._24_5_);
          *(ulong *)((long)&pnVar5[iVar4].m_backend.data + 0x20) =
               CONCAT35(local_b8.data._M_elems[9]._1_3_,local_b8.data._M_elems._32_5_);
          pnVar5[iVar4].m_backend.exp = local_b8.exp;
          pnVar5[iVar4].m_backend.neg = local_b8.neg;
          pnVar5[iVar4].m_backend.fpclass = local_b8.fpclass;
          pnVar5[iVar4].m_backend.prec_elem = local_b8.prec_elem;
          iVar19 = this->m_i;
          pnVar5 = (y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pnVar5[iVar19].m_backend.data + 0x20) =
               *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems + 8);
          uVar8 = *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems
          ;
          uVar15 = *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems + 2);
          uVar16 = *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems + 6);
          puVar2 = (uint *)((long)&pnVar5[iVar19].m_backend.data + 0x10);
          *(undefined8 *)puVar2 =
               *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)local_78._56_8_)->data)._M_elems + 4);
          *(undefined8 *)(puVar2 + 2) = uVar16;
          *(undefined8 *)&pnVar5[iVar19].m_backend.data = uVar8;
          *(undefined8 *)((long)&pnVar5[iVar19].m_backend.data + 8) = uVar15;
          pnVar5[iVar19].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
          pnVar5[iVar19].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
          iVar17 = (this->m_i_rowObj).m_backend.prec_elem;
          pnVar5[iVar19].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
          pnVar5[iVar19].m_backend.prec_elem = iVar17;
          pNVar9 = (this->m_scale).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pNVar7 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)((long)(pNVar9->val).m_backend.data._M_elems + lVar23);
          local_78._48_4_ = cpp_dec_float_finite;
          local_78._52_4_ = 10;
          local_78._0_4_ = 0;
          local_78._4_4_ = 0;
          local_78._8_4_ = 0;
          local_78._12_4_ = 0;
          local_78._16_4_ = 0;
          local_78._20_4_ = 0;
          local_78._24_5_ = 0;
          local_78._29_3_ = 0;
          local_78._32_5_ = 0;
          local_78._37_3_ = 0;
          local_78._40_4_ = 0;
          local_78[0x2c] = false;
          pNVar27 = pNVar7;
          if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_78 != pNVar9) &&
             (pNVar27 = pNVar9,
             pNVar7 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)local_78)) {
            uVar8 = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 8);
            local_78._32_5_ = (undefined5)uVar8;
            local_78._37_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            local_78._0_8_ = *(undefined8 *)(pNVar7->val).m_backend.data._M_elems;
            local_78._8_8_ = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 2);
            local_78._16_8_ = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 4);
            uVar8 = *(undefined8 *)((pNVar7->val).m_backend.data._M_elems + 6);
            local_78._24_5_ = (undefined5)uVar8;
            local_78._29_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            local_78._40_4_ = *(int *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar23);
            local_78[0x2c] = *(undefined1 *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar23 + 4)
            ;
            local_78._48_8_ =
                 *(undefined8 *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar23 + 8);
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    ((cpp_dec_float<50U,_int,_void> *)local_78,
                     (cpp_dec_float<50U,_int,_void> *)pNVar27);
          VVar22 = ON_LOWER;
          if (local_78._48_4_ != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&local_b8,0,(type *)0x0);
            y = local_38;
            iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_78,&local_b8);
            VVar22 = (VarStatus)(iVar19 < 1);
          }
        }
        pVVar28 = rStatus->data;
        pVVar28[iVar4] = VVar22;
        bVar18 = true;
        if (iVar4 != this->m_i) {
          pVVar28 = pVVar28 + this->m_i;
          bVar18 = true;
          goto LAB_0033297d;
        }
      }
LAB_00332985:
      lVar20 = lVar20 + 1;
      lVar23 = lVar23 + 0x3c;
    } while (lVar20 < (this->m_scale).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateRowsPS::execute(VectorBase<R>&, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the duplicated rows:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int rIdx_new = m_perm[i];
            int rIdx = i;
            s[rIdx] = s[rIdx_new];
            y[rIdx] = y[rIdx_new];
            rStatus[rIdx] = rStatus[rIdx_new];
         }
      }
   }

   // primal:
   for(int k = 0; k < m_scale.size(); ++k)
   {
      if(m_scale.index(k) != m_i)
         s[m_scale.index(k)] = s[m_i] / m_scale.value(k);
   }

   // dual & basis:
   bool haveSetBasis = false;

   for(int k = 0; k < m_scale.size(); ++k)
   {
      int i = m_scale.index(k);

      if(rStatus[m_i] == SPxSolverBase<R>::BASIC || (haveSetBasis && i != m_i))
         // if the row with tightest lower and upper bound in the basic, every duplicate row should in basic
         // or basis status of row m_i has been set, this row should be in basis
      {
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
         continue;
      }

      SOPLEX_ASSERT_WARN("WMAISM02", isNotZero(m_scale.value(k), this->epsilon()));

      if(rStatus[m_i] == SPxSolverBase<R>::FIXED && (i == m_maxLhsIdx || i == m_minRhsIdx))
      {
         // this row leads to the tightest lower or upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         if(m_isLhsEqualRhs[k])
         {
            rStatus[i] = SPxSolverBase<R>::FIXED;
         }
         else if(i == m_maxLhsIdx)
         {
            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                         SPxSolverBase<R>::ON_UPPER;
         }
         else
         {
            assert(i == m_minRhsIdx);

            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                         SPxSolverBase<R>::ON_LOWER;
         }

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_maxLhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
      {
         // this row leads to the tightest lower bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                      SPxSolverBase<R>::ON_UPPER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_minRhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
      {
         // this row leads to the tightest upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                      SPxSolverBase<R>::ON_LOWER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i != m_i)
      {
         // this row does not lead to the tightest lower or upper bound, slack should be in the basis
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
      }
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(m_isFirst && !this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM24 Dimension doesn't match after this step.");
   }

#endif

   // nothing to do for the reduced cost values
}